

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::createShaderStage
          (PushConstantGraphicsTestInstance *this,DeviceInterface *vk,VkDevice device,
          BinaryCollection *programCollection,char *name,VkShaderStageFlagBits stage,
          Move<vk::Handle<(vk::HandleType)14>_> *module)

{
  pointer *ppVVar1;
  VkShaderModule obj;
  iterator __position;
  const_iterator cVar2;
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  allocator<char> local_a9;
  undefined1 local_a8 [24];
  VkShaderModule VStack_90;
  char *local_88;
  VkSpecializationInfo *pVStack_80;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_a9);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)programCollection,&local_50);
  ::vk::createShaderModule(&local_78,vk,device,*(ProgramBinary **)(cVar2._M_node + 2),0);
  local_a8._16_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  VStack_90.m_internal =
       (deUint64)local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_a8._0_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_a8._8_8_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter,obj);
  }
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
       (VkDevice)local_a8._16_8_;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_90.m_internal;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = local_a8._0_8_
  ;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_a8._8_8_;
  if (local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_a8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_a8._8_8_ = (void *)0x0;
  local_a8._16_8_ = (ulong)stage << 0x20;
  VStack_90.m_internal =
       (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  local_88 = "main";
  pVStack_80 = (VkSpecializationInfo *)0x0;
  __position._M_current =
       (this->m_shaderStage).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_shaderStage).
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
    ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
              ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                *)&this->m_shaderStage,__position,(VkPipelineShaderStageCreateInfo *)local_a8);
  }
  else {
    (__position._M_current)->pName = "main";
    (__position._M_current)->pSpecializationInfo = (VkSpecializationInfo *)0x0;
    (__position._M_current)->flags = local_a8._16_4_;
    (__position._M_current)->stage = local_a8._20_4_;
    ((__position._M_current)->module).m_internal = VStack_90.m_internal;
    *(undefined8 *)__position._M_current = local_a8._0_8_;
    (__position._M_current)->pNext = (void *)0x0;
    ppVVar1 = &(this->m_shaderStage).
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void PushConstantGraphicsTestInstance::createShaderStage (const DeviceInterface&	vk,
														  VkDevice					device,
														  const BinaryCollection&	programCollection,
														  const char*				name,
														  VkShaderStageFlagBits		stage,
														  Move<VkShaderModule>*		module)
{
	*module = createShaderModule(vk, device, programCollection.get(name), 0);

	const vk::VkPipelineShaderStageCreateInfo	stageCreateInfo	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0u,														// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		**module,												// VkShaderModule						module;
		"main",													// const char*							pName;
		DE_NULL													// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStage.push_back(stageCreateInfo);
}